

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<std::pair<QPersistentModelIndex,_unsigned_int>_>::reallocate
          (QMovableArrayOps<std::pair<QPersistentModelIndex,_unsigned_int>_> *this,qsizetype alloc,
          AllocationOption option)

{
  pair<QTypedArrayData<std::pair<QPersistentModelIndex,_unsigned_int>_>_*,_std::pair<QPersistentModelIndex,_unsigned_int>_*>
  pVar1;
  
  pVar1 = QTypedArrayData<std::pair<QPersistentModelIndex,_unsigned_int>_>::reallocateUnaligned
                    ((this->super_QGenericArrayOps<std::pair<QPersistentModelIndex,_unsigned_int>_>)
                     .super_QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_>.d,
                     (this->super_QGenericArrayOps<std::pair<QPersistentModelIndex,_unsigned_int>_>)
                     .super_QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_>.ptr,
                     alloc,option);
  if (pVar1.second != (pair<QPersistentModelIndex,_unsigned_int> *)0x0) {
    (this->super_QGenericArrayOps<std::pair<QPersistentModelIndex,_unsigned_int>_>).
    super_QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_>.d = pVar1.first;
    (this->super_QGenericArrayOps<std::pair<QPersistentModelIndex,_unsigned_int>_>).
    super_QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_>.ptr = pVar1.second;
    return;
  }
  qBadAlloc();
}

Assistant:

void reallocate(qsizetype alloc, QArrayData::AllocationOption option)
    {
        auto pair = Data::reallocateUnaligned(this->d, this->ptr, alloc, option);
        Q_CHECK_PTR(pair.second);
        Q_ASSERT(pair.first != nullptr);
        this->d = pair.first;
        this->ptr = pair.second;
    }